

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O1

size_t data_init(data_t *data,data_val_t *buf,int level,int batch)

{
  data_val_t *pdVar1;
  long lVar2;
  
  lVar2 = (long)batch * (long)data->size;
  if ((int)lVar2 != 0) {
    data->val = buf;
    data->grad = buf;
    pdVar1 = buf + lVar2;
    if (0 < level) {
      data->grad = pdVar1;
      pdVar1 = pdVar1 + lVar2;
    }
    if (1 < level) {
      data->m = pdVar1;
      pdVar1 = pdVar1 + lVar2;
    }
    if (2 < level) {
      data->v = pdVar1;
      pdVar1 = pdVar1 + lVar2;
    }
    return (long)pdVar1 - (long)buf >> 2;
  }
  return 0;
}

Assistant:

size_t data_init(data_t *data, data_val_t *buf, int level, int batch)
{
    data_val_t *start = buf;
    size_t data_size = data->size * batch;

    if (0 == data_size)
        return 0;

    data->val = buf;
    data->grad = data->val;
    buf += data_size;
#ifdef USE_CUDA
    if (cudaSuccess != cudaMalloc((void **)&data->cuval, data_size * sizeof(data_val_t)))
    {
        LOG("fail to alloc %ld bytes memory in cuda, you can try with a smaller batch size.\n", data_size * sizeof(data_val_t));
        exit(1);
    }

    data->cugrad = data->cuval;
#elif defined(USE_OPENCL)
    cl_int clRet = 0;
    data->clval.size = data_size * sizeof(data_val_t);
    data->clval.buf = clCreateBuffer(cl_get_default_context(), CL_MEM_READ_WRITE | CL_MEM_USE_HOST_PTR, data->clval.size, data->val, &clRet);
    if (clRet != CL_SUCCESS)
    {
        LOG("fail to alloc %d bytes memory in opencl, you can try with a smaller batch size.\n", data->clval.size);
        exit(1);
    }

    cl_data_map(&data->clval);
    data->clgrad = data->clval;
#endif

    if (level > 0)
    {
        data->grad = buf;
        buf += data_size;
#ifdef USE_CUDA
        if (cudaSuccess != cudaMalloc((void **)&data->cugrad, data_size * sizeof(data_val_t)))
        {
            LOG("fail to alloc %ld bytes memory in cuda, you can try with a smaller batch size.\n", data_size * sizeof(data_val_t));
            exit(1);
        }
#elif defined(USE_OPENCL)
        cl_int clRet = 0;
        data->clgrad.size = data_size * sizeof(data_val_t);
        data->clgrad.buf = clCreateBuffer(cl_get_default_context(), CL_MEM_READ_WRITE | CL_MEM_USE_HOST_PTR, data->clgrad.size, data->grad, &clRet);
        if (clRet != CL_SUCCESS)
        {
            LOG("fail to alloc %d bytes memory in opencl, you can try with a smaller batch size.\n", data->clgrad.size);
            exit(1);
        }

        cl_data_map(&data->clgrad);
#endif
    }

    if (level > 1)
    {
        data->m = buf;
        buf += data_size;
    }

    if (level > 2)
    {
        data->v = buf;
        buf += data_size;
    }

    return buf - start;
}